

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::ReadUInt(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int i;
  longlong result;
  uchar m;
  int status;
  uchar b;
  int local_3c;
  ulong local_38;
  byte local_29;
  byte local_21;
  long *local_20;
  long local_18;
  undefined8 *local_10;
  ulong local_8;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI < 0)) {
    local_8 = 0xfffffffffffffffe;
  }
  else {
    *in_RDX = 1;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = (**(code **)*in_RDI)(in_RDI,in_RSI,1,&local_21);
    if (iVar1 < 0) {
      local_8 = (ulong)iVar1;
    }
    else if (iVar1 < 1) {
      if (local_21 == 0) {
        local_8 = 0xfffffffffffffffe;
      }
      else {
        for (local_29 = 0x80; (local_21 & local_29) == 0;
            local_29 = (byte)((int)(uint)local_29 >> 1)) {
          *local_20 = *local_20 + 1;
        }
        local_38 = (ulong)(int)((uint)local_21 & (local_29 ^ 0xffffffff));
        for (local_3c = 1; local_18 = local_18 + 1, (long)local_3c < *local_20;
            local_3c = local_3c + 1) {
          iVar1 = (**(code **)*local_10)(local_10,local_18,1,&local_21);
          if (iVar1 < 0) {
            *local_20 = 1;
            return (long)iVar1;
          }
          if (0 < iVar1) {
            *local_20 = 1;
            return -3;
          }
          local_38 = (ulong)local_21 | local_38 << 8;
        }
        local_8 = local_38;
      }
    }
    else {
      local_8 = 0xfffffffffffffffd;
    }
  }
  return local_8;
}

Assistant:

long long ReadUInt(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  len = 1;
  unsigned char b;
  int status = pReader->Read(pos, 1, &b);

  if (status < 0)  // error or underflow
    return status;

  if (status > 0)  // interpreted as "underflow"
    return E_BUFFER_NOT_FULL;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  long long result = b & (~m);
  ++pos;

  for (int i = 1; i < len; ++i) {
    status = pReader->Read(pos, 1, &b);

    if (status < 0) {
      len = 1;
      return status;
    }

    if (status > 0) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}